

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O3

int create_gear(gears_t_conflict1 *gears,int id,float inner,float outer,float width,int teeth,
               float tooth_depth)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  gear_conflict *pgVar9;
  Vertex *pafVar10;
  Strip *pSVar11;
  long lVar12;
  float *pfVar13;
  char *pcVar14;
  long lVar15;
  float *__sinx;
  long lVar16;
  float fVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float in_XMM1_Db;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float s [5];
  float c [5];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  int local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  int local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  gears_t_conflict1 *local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_d4 = width;
  local_d0 = inner;
  local_b8 = outer;
  fStack_b4 = in_XMM1_Db;
  fStack_b0 = in_XMM1_Dc;
  fStack_ac = in_XMM1_Dd;
  pgVar9 = (gear_conflict *)calloc(1,0x28);
  if (pgVar9 == (gear_conflict *)0x0) {
    puts("calloc gear failed");
    return -1;
  }
  gears->gear[(uint)id] = pgVar9;
  pafVar10 = (Vertex *)calloc((ulong)(uint)(teeth * 0x22),0x20);
  pgVar9->vertices = pafVar10;
  if (pafVar10 == (Vertex *)0x0) {
    pcVar14 = "calloc vertices failed";
  }
  else {
    pgVar9->nstrips = teeth * 7;
    pSVar11 = (Strip *)calloc((ulong)(uint)(teeth * 7),8);
    pgVar9->strips = pSVar11;
    if (pSVar11 != (Strip *)0x0) {
      local_d8 = id;
      local_a8 = gears;
      if (0 < teeth) {
        local_c8 = 6.2831855 / (float)teeth;
        local_48 = local_b8 + 0.35;
        local_68 = local_b8 + -0.35;
        fStack_40 = local_b8 + 0.0;
        fStack_3c = local_b8 + 0.0;
        fStack_b4 = local_b8 + 0.35;
        fStack_b0 = local_b8 + 0.0;
        fStack_ac = local_b8 + 0.0;
        local_c0 = local_c8 * 0.25;
        dVar4 = (double)local_48 * 0.36;
        dVar3 = (double)local_68;
        local_cc = local_d4 * 0.5;
        dVar5 = dVar3 * 0.36;
        local_d4 = local_d4 * -0.5;
        local_b8 = -(local_b8 + -0.35);
        fStack_b4 = -fStack_b4;
        fStack_b0 = -fStack_b0;
        fStack_ac = -fStack_ac;
        dVar6 = (double)local_d0 * 0.36;
        local_98._8_4_ = SUB84(dVar6,0);
        local_98._0_8_ = dVar6;
        local_98._12_4_ = (int)((ulong)dVar6 >> 0x20);
        local_78._8_4_ = SUB84(dVar3,0);
        local_78._0_8_ = dVar3;
        local_78._12_4_ = (int)((ulong)dVar3 >> 0x20);
        local_88._8_4_ = SUB84(dVar5,0);
        local_88._0_8_ = dVar5;
        local_88._12_4_ = (int)((ulong)dVar5 >> 0x20);
        local_58._8_4_ = SUB84(dVar4,0);
        local_58._0_8_ = dVar4;
        local_58._12_4_ = (int)((ulong)dVar4 >> 0x20);
        lVar15 = 0;
        iVar7 = 0;
        local_a0 = (ulong)(uint)teeth;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        fStack_44 = local_68;
        do {
          local_bc = (float)iVar7 * local_c8;
          pfVar13 = &local_f8;
          lVar16 = 0;
          __sinx = &local_118;
          local_c4 = iVar7;
          do {
            sincosf((float)(int)lVar16 * local_c0 + local_bc,__sinx,pfVar13);
            lVar16 = lVar16 + 1;
            pfVar13 = pfVar13 + 1;
            __sinx = __sinx + 1;
          } while (lVar16 != 5);
          iVar7 = pgVar9->nvertices;
          lVar12 = (long)iVar7;
          pSVar11 = pgVar9->strips;
          pSVar11[lVar15].begin = iVar7;
          pafVar10 = pgVar9->vertices;
          lVar16 = lVar12 + 7;
          lVar1 = lVar12 + 0xe;
          lVar2 = lVar12 + 0x12;
          pafVar10[lVar12][0] = local_48 * fStack_f4;
          pafVar10[lVar12][1] = fStack_114 * local_48;
          pafVar10[lVar12][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12) + 0x10) = 0.0;
          auVar19._0_8_ = (double)fStack_114 * (double)local_58._0_8_;
          auVar19._8_8_ = (double)fStack_f4 * (double)local_58._8_8_;
          auVar19 = divpd(auVar19,local_78);
          pafVar10[lVar12][5] = 1.0;
          *(ulong *)(pafVar10[lVar12] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 1][0] = local_48 * fStack_f0;
          pafVar10[lVar12 + 1][1] = fStack_110 * local_48;
          pafVar10[lVar12 + 1][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 1) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 1) + 0x10) = 0.0;
          pafVar10[lVar12 + 1][5] = 1.0;
          auVar20._0_8_ = (double)fStack_110 * (double)local_58._0_8_;
          auVar20._8_8_ = (double)fStack_f0 * (double)local_58._8_8_;
          auVar19 = divpd(auVar20,local_78);
          *(ulong *)(pafVar10[lVar12 + 1] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 2][0] = local_68 * local_f8;
          pafVar10[lVar12 + 2][1] = local_118 * local_68;
          pafVar10[lVar12 + 2][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 2) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 2) + 0x10) = 0.0;
          pafVar10[lVar12 + 2][5] = 1.0;
          auVar21._0_8_ = (double)local_118 * (double)local_88._0_8_;
          auVar21._8_8_ = (double)local_f8 * (double)local_88._8_8_;
          auVar19 = divpd(auVar21,local_78);
          *(ulong *)(pafVar10[lVar12 + 2] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 3][0] = local_68 * fStack_ec;
          pafVar10[lVar12 + 3][1] = fStack_10c * local_68;
          pafVar10[lVar12 + 3][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 3) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 3) + 0x10) = 0.0;
          pafVar10[lVar12 + 3][5] = 1.0;
          auVar22._0_8_ = (double)fStack_10c * (double)local_88._0_8_;
          auVar22._8_8_ = (double)fStack_ec * (double)local_88._8_8_;
          auVar19 = divpd(auVar22,local_78);
          *(ulong *)(pafVar10[lVar12 + 3] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 4][0] = local_f8 * local_d0;
          pafVar10[lVar12 + 4][1] = local_118 * local_d0;
          pafVar10[lVar12 + 4][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 4) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 4) + 0x10) = 0.0;
          auVar23._0_8_ = (double)local_118 * (double)local_98._0_8_;
          auVar23._8_8_ = (double)local_f8 * (double)local_98._8_8_;
          auVar19 = divpd(auVar23,local_78);
          pafVar10[lVar12 + 4][5] = 1.0;
          *(ulong *)(pafVar10[lVar12 + 4] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 5][0] = local_68 * local_e8;
          pafVar10[lVar12 + 5][1] = fStack_108 * local_68;
          pafVar10[lVar12 + 5][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 5) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 5) + 0x10) = 0.0;
          auVar24._0_8_ = (double)fStack_108 * (double)local_88._0_8_;
          auVar24._8_8_ = (double)local_e8 * (double)local_88._8_8_;
          auVar19 = divpd(auVar24,local_78);
          pafVar10[lVar12 + 5][5] = 1.0;
          *(ulong *)(pafVar10[lVar12 + 5] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pafVar10[lVar12 + 6][0] = local_e8 * local_d0;
          pafVar10[lVar12 + 6][1] = fStack_108 * local_d0;
          pafVar10[lVar12 + 6][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar12 + 6) + 0xc) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 6) + 0x10) = 0.0;
          auVar25._0_8_ = (double)fStack_108 * (double)local_98._0_8_;
          auVar25._8_8_ = (double)local_e8 * (double)local_98._8_8_;
          auVar19 = divpd(auVar25,local_78);
          pafVar10[lVar12 + 6][5] = 1.0;
          *(ulong *)(pafVar10[lVar12 + 6] + 6) =
               CONCAT44((float)(auVar19._8_8_ + 0.5),(float)(auVar19._0_8_ + 0.5));
          pSVar11[lVar15].count = 7;
          pSVar11[lVar15 + 1].begin = (int)lVar16;
          pafVar10[lVar16][0] = fStack_f4 * local_48;
          pafVar10[lVar16][1] = fStack_114 * local_48;
          pafVar10[lVar16][2] = local_d4;
          pfVar13 = pafVar10[lVar16] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar16][7] = 0.0;
          pafVar10[lVar12 + 8][0] = fStack_f0 * local_48;
          pafVar10[lVar12 + 8][1] = fStack_110 * local_48;
          pafVar10[lVar12 + 8][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 8] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 8][7] = 0.0;
          pafVar10[lVar12 + 9][0] = local_f8 * local_68;
          pafVar10[lVar12 + 9][1] = local_118 * local_68;
          pafVar10[lVar12 + 9][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 9] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 9][7] = 0.0;
          pafVar10[lVar12 + 10][0] = fStack_ec * local_68;
          pafVar10[lVar12 + 10][1] = fStack_10c * local_68;
          pafVar10[lVar12 + 10][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 10] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 10][7] = 0.0;
          pafVar10 = pgVar9->vertices;
          pafVar10[lVar12 + 0xb][0] = local_f8 * local_d0;
          pafVar10[lVar12 + 0xb][1] = local_118 * local_d0;
          pafVar10[lVar12 + 0xb][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0xb] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0xb][7] = 0.0;
          pafVar10[lVar12 + 0xc][0] = local_e8 * local_68;
          pafVar10[lVar12 + 0xc][1] = fStack_108 * local_68;
          pafVar10[lVar12 + 0xc][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0xc] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0xc][7] = 0.0;
          pafVar10[lVar12 + 0xd][0] = local_e8 * local_d0;
          pafVar10[lVar12 + 0xd][1] = fStack_108 * local_d0;
          pafVar10[lVar12 + 0xd][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0xd] + 3;
          pfVar13[0] = 0.0;
          pfVar13[1] = 0.0;
          pfVar13[2] = -1.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0xd][7] = 0.0;
          pSVar11 = pgVar9->strips;
          pSVar11[lVar15 + 1].count = 7;
          pSVar11[lVar15 + 2].begin = (int)lVar1;
          pafVar10[lVar1][0] = local_68 * local_f8;
          pafVar10[lVar1][1] = local_118 * local_68;
          pafVar10[lVar1][2] = local_cc;
          pafVar10[lVar1][7] = 0.0;
          uVar18 = CONCAT44(local_f8 * fStack_44 + fStack_f4 * fStack_b4,
                            fStack_114 * local_48 + local_118 * local_b8);
          pfVar13 = pafVar10[lVar1] + 3;
          *(undefined8 *)pfVar13 = uVar18;
          pfVar13[2] = 0.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0xf][0] = local_f8 * local_68;
          pafVar10[lVar12 + 0xf][1] = local_118 * local_68;
          pafVar10[lVar12 + 0xf][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0xf] + 3;
          *(undefined8 *)pfVar13 = uVar18;
          pfVar13[2] = 0.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0xf][7] = 0.0;
          pafVar10[lVar12 + 0x10][0] = fStack_f4 * local_48;
          pafVar10[lVar12 + 0x10][1] = fStack_114 * local_48;
          pafVar10[lVar12 + 0x10][2] = local_cc;
          pfVar13 = pafVar10[lVar12 + 0x10] + 3;
          *(undefined8 *)pfVar13 = uVar18;
          pfVar13[2] = 0.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0x10][7] = 0.0;
          pafVar10[lVar12 + 0x11][0] = fStack_f4 * local_48;
          pafVar10[lVar12 + 0x11][1] = fStack_114 * local_48;
          pafVar10[lVar12 + 0x11][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0x11] + 3;
          *(undefined8 *)pfVar13 = uVar18;
          pfVar13[2] = 0.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0x11][7] = 0.0;
          pSVar11[lVar15 + 2].count = 4;
          pSVar11[lVar15 + 3].begin = (int)lVar2;
          fVar17 = fStack_110 - fStack_114;
          fVar26 = fStack_f4 - fStack_f0;
          lVar16 = lVar12 + 0x16;
          pafVar10[lVar2][0] = fStack_f4 * local_48;
          pafVar10[lVar2][1] = fStack_114 * local_48;
          pafVar10[lVar2][2] = local_cc;
          pafVar10[lVar2][3] = fVar17;
          pafVar10[lVar2][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar2) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar2) + 0x18) = 0.0;
          pafVar10[lVar2][7] = 0.0;
          pafVar10[lVar12 + 0x13][0] = fStack_f4 * local_48;
          pafVar10[lVar12 + 0x13][1] = fStack_114 * local_48;
          pafVar10[lVar12 + 0x13][2] = local_d4;
          pafVar10[lVar12 + 0x13][3] = fVar17;
          pafVar10[lVar12 + 0x13][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x13) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x13) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x13][7] = 0.0;
          pafVar10[lVar12 + 0x14][0] = fStack_f0 * local_48;
          pafVar10[lVar12 + 0x14][1] = fStack_110 * local_48;
          pafVar10[lVar12 + 0x14][2] = local_cc;
          pafVar10[lVar12 + 0x14][3] = fVar17;
          pafVar10[lVar12 + 0x14][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x14) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x14) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x14][7] = 0.0;
          pafVar10[lVar12 + 0x15][0] = fStack_f0 * local_48;
          pafVar10[lVar12 + 0x15][1] = fStack_110 * local_48;
          pafVar10[lVar12 + 0x15][2] = local_d4;
          pafVar10[lVar12 + 0x15][3] = fVar17;
          pafVar10[lVar12 + 0x15][4] = fVar26;
          pafVar10[lVar12 + 0x15][5] = 0.0;
          pafVar10 = pgVar9->vertices;
          *(float *)((long)(pafVar10 + lVar12 + 0x15) + 0x18) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x15) + 0x1c) = 0.0;
          pSVar11[lVar15 + 3].count = 4;
          pSVar11[lVar15 + 4].begin = (int)lVar16;
          pafVar10[lVar16][0] = local_48 * fStack_f0;
          pafVar10[lVar16][1] = fStack_110 * local_48;
          lVar1 = lVar12 + 0x1a;
          pafVar10[lVar16][2] = local_cc;
          *(float *)((long)(pafVar10 + lVar16) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar16) + 0x18) = 0.0;
          pafVar10[lVar16][7] = 0.0;
          fVar17 = fStack_f0 * local_48 + fStack_ec * local_b8;
          fVar26 = fStack_10c * fStack_44 + fStack_110 * fStack_b4;
          pafVar10[lVar16][3] = fVar26;
          pafVar10[lVar16][4] = fVar17;
          pafVar10[lVar12 + 0x17][0] = fStack_f0 * local_48;
          pafVar10[lVar12 + 0x17][1] = fStack_110 * local_48;
          pafVar10[lVar12 + 0x17][2] = local_d4;
          pafVar10[lVar12 + 0x17][3] = fVar26;
          pafVar10[lVar12 + 0x17][4] = fVar17;
          *(float *)((long)(pafVar10 + lVar12 + 0x17) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x17) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x17][7] = 0.0;
          pafVar10[lVar12 + 0x18][0] = fStack_ec * local_68;
          pafVar10[lVar12 + 0x18][1] = fStack_10c * local_68;
          pafVar10[lVar12 + 0x18][2] = local_cc;
          pafVar10[lVar12 + 0x18][3] = fVar26;
          pafVar10[lVar12 + 0x18][4] = fVar17;
          *(float *)((long)(pafVar10 + lVar12 + 0x18) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x18) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x18][7] = 0.0;
          pafVar10[lVar12 + 0x19][0] = fStack_ec * local_68;
          pafVar10[lVar12 + 0x19][1] = fStack_10c * local_68;
          pafVar10[lVar12 + 0x19][2] = local_d4;
          pfVar13 = pafVar10[lVar12 + 0x19] + 3;
          *(ulong *)pfVar13 = CONCAT44(fVar17,fVar26);
          pfVar13[2] = 0.0;
          pfVar13[3] = 0.0;
          pafVar10[lVar12 + 0x19][7] = 0.0;
          pSVar11 = pgVar9->strips;
          pSVar11[lVar15 + 4].count = 4;
          pSVar11[lVar15 + 5].begin = (int)lVar1;
          fVar17 = fStack_108 - fStack_10c;
          fVar26 = fStack_ec - local_e8;
          pafVar10[lVar1][0] = fStack_ec * local_68;
          pafVar10[lVar1][1] = fStack_10c * local_68;
          pafVar10[lVar1][2] = local_cc;
          pafVar10[lVar1][3] = fVar17;
          pafVar10[lVar1][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar1) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar1) + 0x18) = 0.0;
          pafVar10[lVar1][7] = 0.0;
          pafVar10[lVar12 + 0x1b][0] = fStack_ec * local_68;
          pafVar10[lVar12 + 0x1b][1] = fStack_10c * local_68;
          pafVar10[lVar12 + 0x1b][2] = local_d4;
          pafVar10[lVar12 + 0x1b][3] = fVar17;
          pafVar10[lVar12 + 0x1b][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x1b) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x1b) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x1b][7] = 0.0;
          pafVar10[lVar12 + 0x1c][0] = local_e8 * local_68;
          pafVar10[lVar12 + 0x1c][1] = fStack_108 * local_68;
          pafVar10[lVar12 + 0x1c][2] = local_cc;
          pafVar10[lVar12 + 0x1c][3] = fVar17;
          pafVar10[lVar12 + 0x1c][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x1c) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x1c) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x1c][7] = 0.0;
          pafVar10[lVar12 + 0x1d][0] = local_e8 * local_68;
          pafVar10[lVar12 + 0x1d][1] = fStack_108 * local_68;
          pafVar10[lVar12 + 0x1d][2] = local_d4;
          pafVar10[lVar12 + 0x1d][3] = fVar17;
          pafVar10[lVar12 + 0x1d][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x1d) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x1d) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x1d][7] = 0.0;
          lVar16 = lVar12 + 0x1e;
          pSVar11[lVar15 + 5].count = 4;
          pSVar11[lVar15 + 6].begin = (int)lVar16;
          fVar17 = local_118 - fStack_108;
          fVar26 = local_e8 - local_f8;
          pafVar10[lVar16][0] = local_f8 * local_d0;
          pafVar10[lVar16][1] = local_118 * local_d0;
          pafVar10[lVar16][2] = local_cc;
          pafVar10[lVar16][3] = fVar17;
          pafVar10[lVar16][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar16) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar16) + 0x18) = 0.0;
          pafVar10[lVar16][7] = 0.0;
          pafVar10[lVar12 + 0x1f][0] = local_f8 * local_d0;
          pafVar10[lVar12 + 0x1f][1] = local_118 * local_d0;
          pafVar10[lVar12 + 0x1f][2] = local_d4;
          pafVar10[lVar12 + 0x1f][3] = fVar17;
          pafVar10[lVar12 + 0x1f][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x1f) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x1f) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x1f][7] = 0.0;
          pafVar10[lVar12 + 0x20][0] = local_e8 * local_d0;
          pafVar10[lVar12 + 0x20][1] = fStack_108 * local_d0;
          pafVar10 = pgVar9->vertices;
          pafVar10[lVar12 + 0x20][2] = local_cc;
          pafVar10[lVar12 + 0x20][3] = fVar17;
          pafVar10[lVar12 + 0x20][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x20) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x20) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x20][7] = 0.0;
          pafVar10[lVar12 + 0x21][0] = local_e8 * local_d0;
          pafVar10[lVar12 + 0x21][1] = fStack_108 * local_d0;
          pafVar10[lVar12 + 0x21][2] = local_d4;
          pafVar10[lVar12 + 0x21][3] = fVar17;
          pafVar10[lVar12 + 0x21][4] = fVar26;
          *(float *)((long)(pafVar10 + lVar12 + 0x21) + 0x14) = 0.0;
          *(float *)((long)(pafVar10 + lVar12 + 0x21) + 0x18) = 0.0;
          pafVar10[lVar12 + 0x21][7] = 0.0;
          pgVar9->nvertices = iVar7 + 0x22;
          pSVar11[lVar15 + 6].count = 4;
          lVar15 = lVar15 + 7;
          iVar7 = local_c4 + 1;
        } while (iVar7 != (int)local_a0);
      }
      gears = local_a8;
      (*local_a8->glGenBuffers)(1,&pgVar9->vbo);
      if (pgVar9->vbo == 0) {
        puts("glGenBuffers failed");
        id = local_d8;
      }
      else {
        (*gears->glBindBuffer)(0x8892,pgVar9->vbo);
        uVar8 = (*gears->glGetError)();
        if (uVar8 == 0) {
          (*gears->glBufferData)(0x8892,(long)pgVar9->nvertices << 5,pgVar9->vertices,0x88e4);
          uVar8 = (*gears->glGetError)();
          if (uVar8 == 0) {
            return 0;
          }
          pcVar14 = "glBufferData failed: 0x%x\n";
        }
        else {
          pcVar14 = "glBindBuffer failed: 0x%x\n";
        }
        printf(pcVar14,(ulong)uVar8);
        id = local_d8;
      }
      goto LAB_0010754a;
    }
    pcVar14 = "calloc strips failed";
  }
  puts(pcVar14);
LAB_0010754a:
  delete_gear(gears,id);
  return -1;
}

Assistant:

static int create_gear(gears_t *gears, int id, float inner, float outer, float width, int teeth, float tooth_depth)
{
  struct gear *gear;
  float r0, r1, r2, da, a1, ai, s[5], c[5];
  int i, j;
  float n[3], t[2];
  int k = 0;
  GLenum err = GL_NO_ERROR;

  gear = calloc(1, sizeof(struct gear));
  if (!gear) {
    printf("calloc gear failed\n");
    return -1;
  }

  gears->gear[id] = gear;

  gear->nvertices = 0;
  gear->vertices = calloc(34 * teeth, sizeof(Vertex));
  if (!gear->vertices) {
    printf("calloc vertices failed\n");
    goto out;
  }

  gear->nstrips = 7 * teeth;
  gear->strips = calloc(gear->nstrips, sizeof(Strip));
  if (!gear->strips) {
    printf("calloc strips failed\n");
    goto out;
  }

  r0 = inner;
  r1 = outer - tooth_depth / 2;
  r2 = outer + tooth_depth / 2;
  a1 = 2 * M_PI / teeth;
  da = a1 / 4;

  #define normal(nx, ny, nz) \
    n[0] = nx; \
    n[1] = ny; \
    n[2] = nz;

  #define texcoord(tx, ty) \
    t[0] = tx; \
    t[1] = ty;

  #define vertex(x, y, z) \
    gear->vertices[gear->nvertices][0] = x; \
    gear->vertices[gear->nvertices][1] = y; \
    gear->vertices[gear->nvertices][2] = z; \
    gear->vertices[gear->nvertices][3] = n[0]; \
    gear->vertices[gear->nvertices][4] = n[1]; \
    gear->vertices[gear->nvertices][5] = n[2]; \
    gear->vertices[gear->nvertices][6] = t[0]; \
    gear->vertices[gear->nvertices][7] = t[1]; \
    gear->nvertices++;

  for (i = 0; i < teeth; i++) {
    ai = i * a1;
    for (j = 0; j < 5; j++) {
      sincosf(ai + j * da, &s[j], &c[j]);
    }

    /* front face begin */
    gear->strips[k].begin = gear->nvertices;
    /* front face normal */
    normal(0, 0, 1);
    /* front face vertices */
    texcoord(0.36 * r2 * s[1] / r1 + 0.5, 0.36 * r2 * c[1] / r1 + 0.5);
    vertex(r2 * c[1], r2 * s[1], width / 2);
    texcoord(0.36 * r2 * s[2] / r1 + 0.5, 0.36 * r2 * c[2] / r1 + 0.5);
    vertex(r2 * c[2], r2 * s[2], width / 2);
    texcoord(0.36 * r1 * s[0] / r1 + 0.5, 0.36 * r1 * c[0] / r1 + 0.5);
    vertex(r1 * c[0], r1 * s[0], width / 2);
    texcoord(0.36 * r1 * s[3] / r1 + 0.5, 0.36 * r1 * c[3] / r1 + 0.5);
    vertex(r1 * c[3], r1 * s[3], width / 2);
    texcoord(0.36 * r0 * s[0] / r1 + 0.5, 0.36 * r0 * c[0] / r1 + 0.5);
    vertex(r0 * c[0], r0 * s[0], width / 2);
    texcoord(0.36 * r1 * s[4] / r1 + 0.5, 0.36 * r1 * c[4] / r1 + 0.5);
    vertex(r1 * c[4], r1 * s[4], width / 2);
    texcoord(0.36 * r0 * s[4] / r1 + 0.5, 0.36 * r0 * c[4] / r1 + 0.5);
    vertex(r0 * c[4], r0 * s[4], width / 2);
    texcoord(0, 0);
    /* front face end */
    gear->strips[k].count = 7;
    k++;

    /* back face begin */
    gear->strips[k].begin = gear->nvertices;
    /* back face normal */
    normal(0, 0, -1);
    /* back face vertices */
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* back face end */
    gear->strips[k].count = 7;
    k++;

    /* first outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* first outward face normal */
    normal(r2 * s[1] - r1 * s[0], r1 * c[0] - r2 * c[1], 0);
    /* first outward face vertices */
    vertex(r1 * c[0], r1 * s[0],  width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    /* first outward face end */
    gear->strips[k].count = 4;
    k++;

    /* second outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* second outward face normal */
    normal(s[2] - s[1], c[1] - c[2], 0);
    /* second outward face vertices */
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    /* second outward face end */
    gear->strips[k].count = 4;
    k++;

    /* third outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* third outward face normal */
    normal(r1 * s[3] - r2 * s[2], r2 * c[2] - r1 * c[3], 0);
    /* third outward face vertices */
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    /* third outward face end */
    gear->strips[k].count = 4;
    k++;

    /* fourth outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* fourth outward face normal */
    normal(s[4] - s[3], c[3] - c[4], 0);
    /* fourth outward face vertices */
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r1 * c[4], r1 * s[4],  width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    /* fourth outward face end */
    gear->strips[k].count = 4;
    k++;

    /* inside face begin */
    gear->strips[k].begin = gear->nvertices;
    /* inside face normal */
    normal(s[0] - s[4], c[4] - c[0], 0);
    /* inside face vertices */
    vertex(r0 * c[0], r0 * s[0],  width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r0 * c[4], r0 * s[4],  width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* inside face end */
    gear->strips[k].count = 4;
    k++;
  }

  /* vertex buffer object */

  gears->glGenBuffers(1, &gear->vbo);
  if (!gear->vbo) {
    printf("glGenBuffers failed\n");
    goto out;
  }

  gears->glBindBuffer(GL_ARRAY_BUFFER, gear->vbo);
  err = gears->glGetError();
  if (err) {
    printf("glBindBuffer failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  gears->glBufferData(GL_ARRAY_BUFFER, gear->nvertices * sizeof(Vertex), gear->vertices, GL_STATIC_DRAW);
  err = gears->glGetError();
  if (err) {
    printf("glBufferData failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  return 0;

out:
  delete_gear(gears, id);
  return -1;
}